

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tc_test.cpp
# Opt level: O0

void __thiscall test_app::test_app(test_app *this,service *srv)

{
  string *psVar1;
  service *in_RSI;
  application *in_RDI;
  allocator local_e1;
  string local_e0 [39];
  allocator local_b9;
  string local_b8 [39];
  allocator local_91;
  string local_90 [39];
  allocator local_69;
  string local_68 [39];
  allocator local_41;
  string local_40 [48];
  service *local_10;
  
  local_10 = in_RSI;
  cppcms::application::application(in_RDI,in_RSI);
  *(undefined ***)in_RDI = &PTR__test_app_00137738;
  std::__cxx11::string::string((string *)(in_RDI + 0x28));
  *(service **)(in_RDI + 0x48) = local_10;
  psVar1 = (string *)cppcms::application::mapper();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,"foo",&local_41);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_68,"/foo",&local_69);
  cppcms::url_mapper::assign(psVar1,local_40);
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  psVar1 = (string *)cppcms::application::mapper();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_90,"/",&local_91);
  cppcms::url_mapper::assign(psVar1);
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  psVar1 = (string *)cppcms::application::mapper();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b8,"/{1}",&local_b9);
  cppcms::url_mapper::assign(psVar1);
  std::__cxx11::string::~string(local_b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_b9);
  psVar1 = (string *)cppcms::application::mapper();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e0,"/{1}/{2}",&local_e1);
  cppcms::url_mapper::assign(psVar1);
  std::__cxx11::string::~string(local_e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_e1);
  return;
}

Assistant:

test_app(cppcms::service &srv) : 
		cppcms::application(srv),
		srv_(srv)
	{
		mapper().assign("foo","/foo");
		mapper().assign("/");
		mapper().assign("/{1}");
		mapper().assign("/{1}/{2}");
	}